

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlresult.cpp
# Opt level: O2

QVariant * __thiscall
QSqlResult::boundValue(QVariant *__return_storage_ptr__,QSqlResult *this,QString *placeholder)

{
  QSqlResultPrivate *pQVar1;
  qsizetype i;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->d_ptr;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QHash<QString,_QList<int>_>::value((QList<int> *)&local_38,&pQVar1->indexes,placeholder);
  if ((undefined1 *)local_38.size == (undefined1 *)0x0) {
    i = -1;
  }
  else {
    i = (qsizetype)*local_38.ptr;
  }
  QList<QVariant>::value(__return_storage_ptr__,&pQVar1->values,i);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QSqlResult::boundValue(const QString& placeholder) const
{
    Q_D(const QSqlResult);
    const QList<int> indexes = d->indexes.value(placeholder);
    return d->values.value(indexes.value(0,-1));
}